

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O2

bool operator==(cmLinkItem *l,cmLinkItem *r)

{
  __type _Var1;
  bool bVar2;
  
  if (l->Target != r->Target) {
    return false;
  }
  _Var1 = std::operator==(&l->String,&r->String);
  if (_Var1) {
    bVar2 = l->Cross == r->Cross;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(cmLinkItem const& l, cmLinkItem const& r)
{
  return l.Target == r.Target && l.String == r.String && l.Cross == r.Cross;
}